

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::calc_divu(PeleLM *this,Real time,Real dt,MultiFab *divu)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  MultiFab *this_00;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  int iVar5;
  int iVar6;
  Long LVar7;
  Long LVar8;
  Long LVar9;
  Long LVar10;
  double *pdVar11;
  Long LVar12;
  Long LVar13;
  double *pdVar14;
  Long LVar15;
  Long LVar16;
  double *pdVar17;
  Long LVar18;
  Long LVar19;
  double *pdVar20;
  Long LVar21;
  Long LVar22;
  double *pdVar23;
  Long LVar24;
  Long LVar25;
  int n;
  int iVar26;
  FabArray<amrex::FArrayBox> *this_01;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  int n_2;
  long lVar51;
  double *pdVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  double *pdVar56;
  long lVar57;
  double *pdVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  double *pdVar63;
  long lVar64;
  long lVar65;
  double *pdVar66;
  bool bVar67;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_bd8;
  long local_bb8;
  long local_bb0;
  long local_ba8;
  long local_ba0;
  long local_b98;
  long local_b90;
  long local_b88;
  long local_b80;
  Real cpor [21];
  Box local_8f4;
  double local_8d8;
  undefined8 uStack_8d0;
  double local_8c8;
  undefined8 uStack_8c0;
  double local_8b8;
  undefined8 uStack_8b0;
  Real tresult [21];
  Array4<const_double> local_7d8;
  Array4<const_double> local_798;
  Array4<const_double> local_758;
  Array4<const_double> local_718;
  Array4<double> local_6d8;
  Array4<const_double> local_698;
  Array4<const_double> local_658;
  Array4<const_double> local_618;
  Array4<const_double> local_5d8;
  double local_598 [22];
  double local_4e8 [22];
  MFIter mfi;
  Real y [21];
  MultiFab RhoYdotTmp;
  MultiFab mcViscTerms;
  
  bxs = &(this->super_NavierStokesBase).super_AmrLevel.grids;
  dm = &(this->super_NavierStokesBase).super_AmrLevel.dmap;
  RhoYdotTmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)0x1;
  RhoYdotTmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ = 0;
  RhoYdotTmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ = 0;
  RhoYdotTmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._12_8_ = 0;
  RhoYdotTmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._20_8_ = 0;
  amrex::MultiFab::MultiFab
            (&mcViscTerms,bxs,dm,0x17,0,(MFInfo *)&RhoYdotTmp,
             (this->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&RhoYdotTmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                m_bndryReg.m_typ);
  iVar5 = NavierStokesBase::do_reflux;
  NavierStokesBase::do_reflux = 0;
  compute_differential_diffusion_terms(this,&mcViscTerms,divu,time,dt,true);
  NavierStokesBase::do_reflux = (int)(iVar5 != 0);
  local_bd8._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)&RhoYdotTmp;
  amrex::MultiFab::MultiFab
            ((MultiFab *)
             local_bd8._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
  this_01 = &amrex::AmrLevel::get_data((AmrLevel *)this,0,time)->super_FabArray<amrex::FArrayBox>;
  if ((time != 0.0) || (dt <= 0.0)) {
    if ((time != 0.0) || (NAN(time))) {
      if (dt <= 0.0) {
        amrex::Abort_host("bad divu_logic - shouldn\'t be here");
      }
      else {
        cpor[0] = 4.94065645841247e-324;
        cpor[1] = 0.0;
        cpor[2] = 0.0;
        cpor[3] = 0.0;
        cpor[4] = 0.0;
        local_bd8._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)&RhoYdotTmp;
        (*RhoYdotTmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase[2])
                  (local_bd8._M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,bxs,dm);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(cpor + 2));
        compute_instantaneous_reaction_rates
                  (this,(MultiFab *)
                        local_bd8._M_t.
                        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                        .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                   (MultiFab *)this_01,(Real)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),0,
                   HT_ZERO_GROW_CELLS);
      }
    }
    else {
      cpor[0] = 4.94065645841247e-324;
      cpor[1] = 0.0;
      cpor[2] = 0.0;
      cpor[3] = 0.0;
      cpor[4] = 0.0;
      local_bd8._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)&RhoYdotTmp;
      (*RhoYdotTmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase[2])
                (local_bd8._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,bxs,dm,0x15,0,cpor,
                 (this->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
                 super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(cpor + 2));
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 local_bd8._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0);
    }
  }
  else {
    local_bd8._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (this->super_NavierStokesBase).super_AmrLevel.state.
         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
         super__Vector_impl_data._M_start[RhoYdot_Type].new_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
  }
  amrex::MFIter::MFIter(&mfi,&this_01->super_FabArrayBase,true);
  this_00 = &this->external_sources;
  while (mfi.currentIndex < mfi.endIndex) {
    amrex::MFIter::tilebox(&local_8f4,&mfi);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_718,this_01,&mfi,first_spec);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_5d8,this_01,&mfi,NavierStokesBase::Temp);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_618,&mcViscTerms.super_FabArray<amrex::FArrayBox>,&mfi,0x16);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_758,&mcViscTerms.super_FabArray<amrex::FArrayBox>,&mfi,0);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_798,
               (FabArray<amrex::FArrayBox> *)
               local_bd8._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_658,&this_00->super_FabArray<amrex::FArrayBox>,&mfi,3);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_7d8,&this_00->super_FabArray<amrex::FArrayBox>,&mfi,4);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_698,&this_00->super_FabArray<amrex::FArrayBox>,&mfi,0x19);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_6d8,&divu->super_FabArray<amrex::FArrayBox>,&mfi);
    LVar25 = local_5d8.kstride;
    LVar24 = local_5d8.jstride;
    pdVar23 = local_5d8.p;
    LVar22 = local_618.kstride;
    LVar21 = local_618.jstride;
    pdVar20 = local_618.p;
    LVar19 = local_658.kstride;
    LVar18 = local_658.jstride;
    pdVar17 = local_658.p;
    LVar16 = local_698.kstride;
    LVar15 = local_698.jstride;
    pdVar14 = local_698.p;
    LVar13 = local_6d8.kstride;
    LVar12 = local_6d8.jstride;
    pdVar11 = local_6d8.p;
    LVar10 = local_718.nstride;
    LVar9 = local_758.nstride;
    LVar8 = local_798.nstride;
    LVar7 = local_7d8.nstride;
    iVar6 = local_8f4.bigend.vect[0];
    iVar5 = local_8f4.smallend.vect[0];
    lVar62 = (long)local_8f4.smallend.vect[1];
    lVar57 = (long)local_8f4.smallend.vect[2];
    lVar60 = local_718.jstride * 8;
    lVar55 = local_718.kstride * 8;
    lVar61 = local_7d8.jstride * 8;
    lVar59 = local_7d8.kstride * 8;
    lVar65 = local_798.jstride * 8;
    lVar27 = local_798.kstride * 8;
    lVar64 = local_758.jstride * 8;
    lVar28 = local_758.kstride * 8;
    local_bb8 = (lVar57 - local_718.begin.z) * lVar55 + (lVar62 - local_718.begin.y) * lVar60 +
                (long)local_718.begin.x * -8 + (long)local_718.p;
    local_b80 = (lVar57 - local_7d8.begin.z) * lVar59 + (lVar62 - local_7d8.begin.y) * lVar61 +
                (long)local_7d8.begin.x * -8 + (long)local_7d8.p;
    local_b88 = (lVar57 - local_798.begin.z) * lVar27 + (lVar62 - local_798.begin.y) * lVar65 +
                (long)local_798.begin.x * -8 + (long)local_798.p;
    local_b90 = (lVar57 - local_758.begin.z) * lVar28 + (lVar62 - local_758.begin.y) * lVar64 +
                (long)local_758.begin.x * -8 + (long)local_758.p;
    lVar29 = (long)local_5d8.begin.x;
    lVar30 = (long)local_5d8.begin.y;
    lVar31 = (long)local_5d8.begin.z;
    lVar32 = (long)local_618.begin.x;
    lVar33 = (long)local_618.begin.y;
    lVar34 = (long)local_618.begin.z;
    lVar35 = (long)local_6d8.begin.x;
    lVar36 = (long)local_6d8.begin.y;
    lVar37 = (long)local_6d8.begin.z;
    lVar38 = (long)local_658.begin.x;
    lVar39 = (long)local_658.begin.y;
    lVar40 = (long)local_658.begin.z;
    lVar41 = (long)local_698.begin.x;
    lVar42 = (long)local_698.begin.y;
    lVar43 = (long)local_698.begin.z;
    lVar44 = (long)local_8f4.bigend.vect[1];
    lVar45 = (long)local_8f4.bigend.vect[2];
    for (; lVar57 <= lVar45; lVar57 = lVar57 + 1) {
      lVar46 = (lVar57 - lVar31) * LVar25;
      lVar47 = (lVar57 - lVar37) * LVar13;
      local_b98 = local_b90;
      local_ba0 = local_b88;
      local_ba8 = local_b80;
      local_bb0 = local_bb8;
      for (lVar54 = lVar62; lVar54 <= lVar44; lVar54 = lVar54 + 1) {
        if (iVar5 <= iVar6) {
          lVar48 = (lVar54 - lVar30) * LVar24;
          lVar49 = (lVar54 - lVar36) * LVar12;
          iVar26 = iVar5;
          do {
            lVar51 = (long)iVar26;
            pdVar63 = (double *)(local_ba8 + lVar51 * 8);
            pdVar58 = (double *)(local_ba0 + lVar51 * 8);
            pdVar66 = (double *)(local_b98 + lVar51 * 8);
            pdVar56 = (double *)(local_bb0 + lVar51 * 8);
            local_598[0] = 0.49603174603174605;
            local_598[1] = 0.9920634920634921;
            local_598[2] = 0.06250390649415588;
            local_598[3] = 0.03125195324707794;
            local_598[4] = 0.05879931792791203;
            local_598[5] = 0.055509297807382736;
            local_598[6] = 0.030297521662727988;
            local_598[7] = 0.07129108148570615;
            local_598[8] = 0.07129108148570615;
            local_598[9] = 0.06651147322913202;
            local_598[10] = 0.06233248145608677;
            local_598[0xb] = 0.035701535166012134;
            local_598[0xc] = 0.022722624917630486;
            local_598[0xd] = 0.03446136880556896;
            local_598[0xe] = 0.033304469459801506;
            local_598[0xf] = 0.032222723464587225;
            local_598[0x10] = 0.035645540742853074;
            local_598[0x11] = 0.034409194136673316;
            local_598[0x12] = 0.03325573661456601;
            local_598[0x13] = 0.03569643749553795;
            local_598[0x14] = 0.025031289111389236;
            dVar4 = 0.0;
            lVar50 = 0x15;
            pdVar52 = pdVar56;
            while (bVar67 = lVar50 != 0, lVar50 = lVar50 + -1, bVar67) {
              dVar4 = dVar4 + *pdVar52;
              pdVar52 = pdVar52 + LVar10;
            }
            dVar75 = 1.0 / dVar4;
            memset(y,0,0xa8);
            for (lVar50 = 0; lVar50 != 0x15; lVar50 = lVar50 + 1) {
              y[lVar50] = *pdVar56 * dVar75;
              pdVar56 = pdVar56 + LVar10;
            }
            dVar70 = pdVar23[lVar46 + lVar48 + (lVar51 - lVar29)];
            local_8d8 = dVar70 * dVar70;
            local_8c8 = dVar70 * local_8d8;
            local_8b8 = dVar70 * local_8c8;
            local_4e8[0] = 0.49603174603174605;
            local_4e8[1] = 0.9920634920634921;
            local_4e8[2] = 0.06250390649415588;
            local_4e8[3] = 0.03125195324707794;
            local_4e8[4] = 0.05879931792791203;
            local_4e8[5] = 0.055509297807382736;
            local_4e8[6] = 0.030297521662727988;
            local_4e8[7] = 0.07129108148570615;
            local_4e8[8] = 0.07129108148570615;
            local_4e8[9] = 0.06651147322913202;
            local_4e8[10] = 0.06233248145608677;
            local_4e8[0xb] = 0.035701535166012134;
            local_4e8[0xc] = 0.022722624917630486;
            local_4e8[0xd] = 0.03446136880556896;
            local_4e8[0xe] = 0.033304469459801506;
            local_4e8[0xf] = 0.032222723464587225;
            local_4e8[0x10] = 0.035645540742853074;
            local_4e8[0x11] = 0.034409194136673316;
            local_4e8[0x12] = 0.03325573661456601;
            local_4e8[0x13] = 0.03569643749553795;
            local_4e8[0x14] = 0.025031289111389236;
            if (1000.0 <= dVar70) {
              cpor[0] = local_8b8 * 2.00255376e-14 +
                        local_8c8 * -1.79566394e-10 +
                        local_8d8 * 4.99456778e-07 + dVar70 * -4.94024731e-05 + 3.3372792;
              cpor[1] = local_8b8 * 4.98197357e-22 +
                        local_8c8 * -4.73515235e-18 +
                        local_8d8 * 1.61561948e-14 + dVar70 * -2.30842973e-11 + 2.50000001;
              cpor[2] = local_8b8 * 1.22833691e-15 +
                        local_8c8 * -1.00177799e-11 +
                        local_8d8 * 4.19484589e-08 + dVar70 * -8.59741137e-05 + 2.56942078;
              cpor[3] = local_8b8 * -2.16717794e-14 +
                        local_8c8 * 2.09470555e-10 +
                        local_8d8 * -7.57966669e-07 + dVar70 * 0.00148308754 + 3.28253784;
              cpor[4] = local_8b8 * 1.17412376e-14 +
                        local_8c8 * -8.79461556e-11 +
                        local_8d8 * 1.26505228e-07 + dVar70 * 0.000548429716 + 3.09288767;
              cpor[5] = local_8b8 * 1.68200992e-14 +
                        local_8c8 * -9.7041987e-11 +
                        local_8d8 * -1.64072518e-07 + dVar70 * 0.00217691804 + 3.03399249;
              cpor[6] = local_8b8 * -1.07908535e-14 +
                        local_8c8 * 1.1424637e-10 +
                        local_8d8 * -6.3365815e-07 + dVar70 * 0.00223982013 + 4.0172109;
              cpor[7] = local_8b8 * -1.87727567e-14 +
                        local_8c8 * 2.60179549e-10 +
                        local_8d8 * -1.40894597e-06 + dVar70 * 0.00365639292 + 2.87410113;
              cpor[8] = local_8b8 * -3.39716365e-14 +
                        local_8c8 * 4.17906e-10 +
                        local_8d8 * -2.01191947e-06 + dVar70 * 0.00465588637 + 2.29203842;
              cpor[9] = local_8b8 * -4.67154394e-14 +
                        local_8c8 * 5.95684644e-10 +
                        local_8d8 * -2.98714348e-06 + dVar70 * 0.00723990037 + 2.28571772;
              cpor[10] = local_8b8 * -1.0181523e-13 +
                         local_8c8 * 1.22292535e-09 +
                         local_8d8 * -5.73285809e-06 + dVar70 * 0.0133909467 + 0.074851495;
              cpor[0xb] = local_8b8 * -2.03647716e-14 +
                          local_8c8 * 2.30053008e-10 +
                          local_8d8 * -9.98825771e-07 + dVar70 * 0.00206252743 + 2.71518561;
              cpor[0xc] = local_8b8 * -4.72084164e-14 +
                          local_8c8 * 5.23490188e-10 +
                          local_8d8 * -2.21481404e-06 + dVar70 * 0.00441437026 + 3.85746029;
              cpor[0xd] = local_8b8 * -5.33508711e-14 +
                          local_8c8 * 5.89161778e-10 +
                          local_8d8 * -2.48445613e-06 + dVar70 * 0.00495695526 + 2.77217438;
              cpor[0xe] = local_8b8 * -8.8385564e-14 +
                          local_8c8 * 1.00641212e-09 +
                          local_8d8 * -4.42258813e-06 + dVar70 * 0.00920000082 + 1.76069008;
              cpor[0xf] = local_8b8 * -2.112616e-14 +
                          local_8c8 * 3.944431e-10 +
                          local_8d8 * -2.656384e-06 + dVar70 * 0.007871497 + 3.770799;
              cpor[0x10] = local_8b8 * -1.25706061e-13 +
                           local_8c8 * 1.47222923e-09 +
                           local_8d8 * -6.71077915e-06 + dVar70 * 0.0146454151 + 2.03611116;
              cpor[0x11] = local_8b8 * -1.49641576e-13 +
                           local_8c8 * 1.75217689e-09 +
                           local_8d8 * -7.98206668e-06 + dVar70 * 0.0173972722 + 1.95465642;
              dVar71 = local_8c8 * 2.21412001e-09 +
                       local_8d8 * -1.00256067e-05 + dVar70 * 0.0216852677 + 1.0718815;
              dVar72 = local_8c8 * 1.0097038e-10 +
                       local_8d8 * -5.68476e-07 + dVar70 * 0.0014879768 + 2.92664;
              dVar68 = -1.9000289e-13;
              dVar69 = -6.753351e-15;
            }
            else {
              cpor[0] = local_8b8 * -7.37611761e-12 +
                        local_8c8 * 2.01572094e-08 +
                        local_8d8 * -1.9478151e-05 + dVar70 * 0.00798052075 + 2.34433112;
              cpor[1] = local_8b8 * -9.27732332e-22 +
                        local_8c8 * 2.30081632e-18 +
                        local_8d8 * -1.99591964e-15 + dVar70 * 7.05332819e-13 + 2.5;
              cpor[2] = local_8b8 * 2.11265971e-12 +
                        local_8c8 * -6.12806624e-09 +
                        local_8d8 * 6.64306396e-06 + dVar70 * -0.00327931884 + 3.1682671;
              cpor[3] = local_8b8 * 3.24372837e-12 +
                        local_8c8 * -9.68129509e-09 +
                        local_8d8 * 9.84730201e-06 + dVar70 * -0.00299673416 + 3.78245636;
              cpor[4] = local_8b8 * 1.3641147e-12 +
                        local_8c8 * -3.88113333e-09 +
                        local_8d8 * 4.61793841e-06 + dVar70 * -0.00240131752 + 3.99201543;
              cpor[5] = local_8b8 * 1.77197817e-12 +
                        local_8c8 * -5.48797062e-09 +
                        local_8d8 * 6.52040211e-06 + dVar70 * -0.0020364341 + 4.19864056;
              cpor[6] = local_8b8 * 9.29225124e-12 +
                        local_8c8 * -2.42763894e-08 +
                        local_8d8 * 2.11582891e-05 + dVar70 * -0.00474912051 + 4.30179801;
              cpor[7] = local_8b8 * 1.68741719e-12 +
                        local_8c8 * -3.85091153e-09 +
                        local_8d8 * 2.79489841e-06 + dVar70 * 0.000968872143 + 3.76267867;
              cpor[8] = local_8b8 * 1.94314737e-12 +
                        local_8c8 * -6.68815981e-09 +
                        local_8d8 * 8.2329622e-06 + dVar70 * -0.00236661419 + 4.19860411;
              cpor[9] = local_8b8 * 2.54385734e-12 +
                        local_8c8 * -6.87117425e-09 +
                        local_8d8 * 5.73021856e-06 + dVar70 * 0.00201095175 + 3.6735904;
              cpor[10] = local_8b8 * 1.66693956e-11 +
                         local_8c8 * -4.84743026e-08 +
                         local_8d8 * 4.91800599e-05 + dVar70 * -0.0136709788 + 5.14987613;
              cpor[0xb] = local_8b8 * -9.04424499e-13 +
                          local_8c8 * 9.07005884e-10 +
                          local_8d8 * 1.01681433e-06 + dVar70 * -0.00061035368 + 3.57953347;
              cpor[0xc] = local_8b8 * -1.43699548e-13 +
                          local_8c8 * 2.45919022e-09 +
                          local_8d8 * -7.12356269e-06 + dVar70 * 0.00898459677 + 2.35677352;
              cpor[0xd] = local_8b8 * 4.33768865e-12 +
                          local_8c8 * -1.33144093e-08 +
                          local_8d8 * 1.37799446e-05 + dVar70 * -0.00324392532 + 4.22118584;
              cpor[0xe] = local_8b8 * 1.31772652e-11 +
                          local_8c8 * -3.79285261e-08 +
                          local_8d8 * 3.73220008e-05 + dVar70 * -0.00990833369 + 4.79372315;
              cpor[0xf] = local_8b8 * 2.07561e-12 +
                          local_8c8 * -7.377636e-09 +
                          local_8d8 * 5.338472e-06 + dVar70 * 0.007216595 + 2.106204;
              cpor[0x10] = local_8b8 * 2.69884373e-11 +
                           local_8c8 * -6.91588753e-08 +
                           local_8d8 * 5.70990292e-05 + dVar70 * -0.00757052247 + 3.95920148;
              cpor[0x11] = local_8b8 * 2.30509004e-11 +
                           local_8c8 * -5.99126606e-08 +
                           local_8d8 * 4.97142807e-05 + dVar70 * -0.00418658892 + 4.30646568;
              dVar71 = local_8c8 * -7.08466285e-08 +
                       local_8d8 * 5.99438288e-05 + dVar70 * -0.0055015427 + 4.29142492;
              dVar72 = local_8c8 * 5.641515e-09 +
                       local_8d8 * -3.963222e-06 + dVar70 * 0.0014082404 + 3.298677;
              dVar68 = 2.68685771e-11;
              dVar69 = -2.444854e-12;
            }
            cpor[0x12] = local_8b8 * dVar68 + dVar71;
            dVar72 = local_8b8 * dVar69 + dVar72;
            auVar3._8_4_ = SUB84(dVar72,0);
            auVar3._0_8_ = cpor[0x12];
            auVar3._12_4_ = (int)((ulong)dVar72 >> 0x20);
            cpor[0x13] = (Real)auVar3._8_8_;
            dVar68 = local_8b8 * 0.0 + local_8c8 * 0.0 + local_8d8 * 0.0 + dVar70 * 0.0 + 2.5;
            cpor[0x14] = dVar68;
            for (lVar50 = 0; lVar50 != 0x15; lVar50 = lVar50 + 1) {
              tresult[lVar50] = cpor[lVar50] * y[lVar50] * local_4e8[lVar50];
            }
            dVar69 = 0.0;
            for (lVar50 = 0; lVar50 != 0x15; lVar50 = lVar50 + 1) {
              dVar69 = dVar69 + tresult[lVar50];
            }
            cpor[0] = 0.49603174603174605;
            cpor[1] = 0.9920634920634921;
            cpor[2] = 0.06250390649415588;
            cpor[3] = 0.03125195324707794;
            cpor[4] = 0.05879931792791203;
            cpor[5] = 0.055509297807382736;
            cpor[6] = 0.030297521662727988;
            cpor[7] = 0.07129108148570615;
            cpor[8] = 0.07129108148570615;
            cpor[9] = 0.06651147322913202;
            cpor[10] = 0.06233248145608677;
            cpor[0xb] = 0.035701535166012134;
            cpor[0xc] = 0.022722624917630486;
            cpor[0xd] = 0.03446136880556896;
            cpor[0xe] = 0.033304469459801506;
            cpor[0xf] = 0.032222723464587225;
            cpor[0x10] = 0.035645540742853074;
            cpor[0x11] = 0.034409194136673316;
            cpor[0x12] = 0.03325573661456601;
            cpor[0x13] = 0.03569643749553795;
            cpor[0x14] = 0.025031289111389236;
            dVar72 = 0.0;
            for (lVar50 = 0; lVar50 != 0x15; lVar50 = lVar50 + 1) {
              dVar72 = dVar72 + y[lVar50] * cpor[lVar50];
            }
            uStack_8d0 = 0;
            uStack_8c0 = 0;
            uStack_8b0 = 0;
            memset(tresult,0,0xa8);
            cpor[0] = 0.49603174603174605;
            cpor[1] = 0.9920634920634921;
            cpor[2] = 0.06250390649415588;
            cpor[3] = 0.03125195324707794;
            cpor[4] = 0.05879931792791203;
            cpor[5] = 0.055509297807382736;
            cpor[6] = 0.030297521662727988;
            cpor[7] = 0.07129108148570615;
            cpor[8] = 0.07129108148570615;
            cpor[9] = 0.06651147322913202;
            cpor[10] = 0.06233248145608677;
            cpor[0xb] = 0.035701535166012134;
            cpor[0xc] = 0.022722624917630486;
            cpor[0xd] = 0.03446136880556896;
            cpor[0xe] = 0.033304469459801506;
            cpor[0xf] = 0.032222723464587225;
            cpor[0x10] = 0.035645540742853074;
            cpor[0x11] = 0.034409194136673316;
            cpor[0x13] = 0.03569643749553795;
            cpor[0x12] = 0.03325573661456601;
            cpor[0x14] = 0.025031289111389236;
            dVar71 = 1.0 / dVar70;
            if (1000.0 <= dVar70) {
              tresult[0] = dVar71 * -950.158922 +
                           local_8b8 * 4.00510752e-15 +
                           local_8c8 * -4.48915985e-11 +
                           local_8d8 * 1.66485593e-07 + dVar70 * -2.47012365e-05 + 3.3372792;
              tresult[1] = dVar71 * 25473.6599 +
                           local_8b8 * 9.96394714e-23 +
                           local_8c8 * -1.18378809e-18 +
                           local_8d8 * 5.38539827e-15 + dVar70 * -1.15421486e-11 + 2.50000001;
              tresult[2] = dVar71 * 29217.5791 +
                           local_8b8 * 2.45667382e-16 +
                           local_8c8 * -2.50444497e-12 +
                           local_8d8 * 1.39828196e-08 + dVar70 * -4.29870569e-05 + 2.56942078;
              tresult[3] = dVar71 * -1088.45772 +
                           local_8b8 * -4.33435588e-15 +
                           local_8c8 * 5.23676387e-11 +
                           local_8d8 * -2.52655556e-07 + dVar70 * 0.00074154377 + 3.28253784;
              tresult[4] = dVar71 * 3858.657 +
                           local_8b8 * 2.34824752e-15 +
                           local_8c8 * -2.19865389e-11 +
                           local_8d8 * 4.21684093e-08 + dVar70 * 0.000274214858 + 3.09288767;
              tresult[5] = dVar71 * -30004.2971 +
                           local_8b8 * 3.36401984e-15 +
                           local_8c8 * -2.42604967e-11 +
                           local_8d8 * -5.46908393e-08 + dVar70 * 0.00108845902 + 3.03399249;
              tresult[6] = dVar71 * 111.856713 +
                           local_8b8 * -2.1581707e-15 +
                           local_8c8 * 2.85615925e-11 +
                           local_8d8 * -2.11219383e-07 + dVar70 * 0.00111991006 + 4.0172109;
              tresult[7] = dVar71 * 46263.604 +
                           local_8b8 * -3.75455134e-15 +
                           local_8c8 * 6.50448872e-11 +
                           local_8d8 * -4.69648657e-07 + dVar70 * 0.00182819646 + 2.87410113;
              tresult[8] = dVar71 * 50925.9997 +
                           local_8b8 * -6.7943273e-15 +
                           local_8c8 * 1.044765e-10 +
                           local_8d8 * -6.70639823e-07 + dVar70 * 0.00232794318 + 2.29203842;
              tresult[9] = dVar71 * 16775.5843 +
                           local_8b8 * -9.34308788e-15 +
                           local_8c8 * 1.48921161e-10 +
                           local_8d8 * -9.95714493e-07 + dVar70 * 0.00361995018 + 2.28571772;
              tresult[10] = dVar71 * -9468.34459 +
                            local_8b8 * -2.0363046e-14 +
                            local_8c8 * 3.05731338e-10 +
                            local_8d8 * -1.9109527e-06 + dVar70 * 0.00669547335 + 0.074851495;
              tresult[0xb] = dVar71 * -14151.8724 +
                             local_8b8 * -4.07295432e-15 +
                             local_8c8 * 5.7513252e-11 +
                             local_8d8 * -3.32941924e-07 + dVar70 * 0.00103126372 + 2.71518561;
              tresult[0xc] = dVar71 * -48759.166 +
                             local_8b8 * -9.44168328e-15 +
                             local_8c8 * 1.30872547e-10 +
                             local_8d8 * -7.38271347e-07 + dVar70 * 0.00220718513 + 3.85746029;
              tresult[0xd] = dVar71 * 4011.91815 +
                             local_8b8 * -1.06701742e-14 +
                             local_8c8 * 1.47290445e-10 +
                             local_8d8 * -8.28152043e-07 + dVar70 * 0.00247847763 + 2.77217438;
              tresult[0xe] = dVar71 * -13995.8323 +
                             local_8b8 * -1.76771128e-14 +
                             local_8c8 * 2.5160303e-10 +
                             local_8d8 * -1.47419604e-06 + dVar70 * 0.00460000041 + 1.76069008;
              tresult[0xf] = dVar71 * 127.83252 +
                             local_8b8 * -4.225232e-15 +
                             local_8c8 * 9.8610775e-11 +
                             local_8d8 * -8.85461333e-07 + dVar70 * 0.0039357485 + 3.770799;
              tresult[0x10] =
                   dVar71 * 4939.88614 +
                   local_8b8 * -2.51412122e-14 +
                   local_8c8 * 3.68057308e-10 +
                   local_8d8 * -2.23692638e-06 + dVar70 * 0.00732270755 + 2.03611116;
              tresult[0x11] =
                   dVar71 * 12857.52 +
                   local_8b8 * -2.99283152e-14 +
                   local_8c8 * 4.38044223e-10 +
                   local_8d8 * -2.66068889e-06 + dVar70 * 0.0086986361 + 1.95465642;
              dVar73 = local_8b8 * -3.8000578e-14 +
                       local_8c8 * 5.53530003e-10 +
                       local_8d8 * -3.3418689e-06 + dVar70 * 0.0108426339 + 1.0718815;
              dVar74 = local_8b8 * -1.3506702e-15 +
                       local_8c8 * 2.5242595e-11 +
                       local_8d8 * -1.89492e-07 + dVar70 * 0.0007439884 + 2.92664;
              dVar1 = -11426.3932;
              dVar2 = -922.7977;
            }
            else {
              tresult[0] = dVar71 * -917.935173 +
                           local_8b8 * -1.47522352e-12 +
                           local_8c8 * 5.03930235e-09 +
                           local_8d8 * -6.492717e-06 + dVar70 * 0.00399026037 + 2.34433112;
              tresult[1] = dVar71 * 25473.6599 +
                           local_8b8 * -1.85546466e-22 +
                           local_8c8 * 5.7520408e-19 +
                           local_8d8 * -6.65306547e-16 + dVar70 * 3.52666409e-13 + 2.5;
              tresult[2] = dVar71 * 29122.2592 +
                           local_8b8 * 4.22531942e-13 +
                           local_8c8 * -1.53201656e-09 +
                           local_8d8 * 2.21435465e-06 + dVar70 * -0.00163965942 + 3.1682671;
              tresult[3] = dVar71 * -1063.94356 +
                           local_8b8 * 6.48745674e-13 +
                           local_8c8 * -2.42032377e-09 +
                           local_8d8 * 3.282434e-06 + dVar70 * -0.00149836708 + 3.78245636;
              tresult[4] = dVar71 * 3615.08056 +
                           local_8b8 * 2.7282294e-13 +
                           local_8c8 * -9.70283332e-10 +
                           local_8d8 * 1.5393128e-06 + dVar70 * -0.00120065876 + 3.99201543;
              tresult[5] = dVar71 * -30293.7267 +
                           local_8b8 * 3.54395634e-13 +
                           local_8c8 * -1.37199266e-09 +
                           local_8d8 * 2.17346737e-06 + dVar70 * -0.00101821705 + 4.19864056;
              tresult[6] = dVar71 * 294.80804 +
                           local_8b8 * 1.85845025e-12 +
                           local_8c8 * -6.06909735e-09 +
                           local_8d8 * 7.05276303e-06 + dVar70 * -0.00237456025 + 4.30179801;
              tresult[7] = dVar71 * 46004.0401 +
                           local_8b8 * 3.37483438e-13 +
                           local_8c8 * -9.62727883e-10 +
                           local_8d8 * 9.31632803e-07 + dVar70 * 0.000484436072 + 3.76267867;
              tresult[8] = dVar71 * 50496.8163 +
                           local_8b8 * 3.88629474e-13 +
                           local_8c8 * -1.67203995e-09 +
                           local_8d8 * 2.74432073e-06 + dVar70 * -0.0011833071 + 4.19860411;
              tresult[9] = dVar71 * 16444.9988 +
                           local_8b8 * 5.08771468e-13 +
                           local_8c8 * -1.71779356e-09 +
                           local_8d8 * 1.91007285e-06 + dVar70 * 0.00100547588 + 3.6735904;
              tresult[10] = dVar71 * -10246.6476 +
                            local_8b8 * 3.33387912e-12 +
                            local_8c8 * -1.21185757e-08 +
                            local_8d8 * 1.63933533e-05 + dVar70 * -0.0068354894 + 5.14987613;
              tresult[0xb] = dVar71 * -14344.086 +
                             local_8b8 * -1.808849e-13 +
                             local_8c8 * 2.26751471e-10 +
                             local_8d8 * 3.3893811e-07 + dVar70 * -0.00030517684 + 3.57953347;
              tresult[0xc] = dVar71 * -48371.9697 +
                             local_8b8 * -2.87399096e-14 +
                             local_8c8 * 6.14797555e-10 +
                             local_8d8 * -2.3745209e-06 + dVar70 * 0.00449229839 + 2.35677352;
              tresult[0xd] = dVar71 * 3839.56496 +
                             local_8b8 * 8.6753773e-13 +
                             local_8c8 * -3.32860233e-09 +
                             local_8d8 * 4.59331487e-06 + dVar70 * -0.00162196266 + 4.22118584;
              tresult[0xe] = dVar71 * -14308.9567 +
                             local_8b8 * 2.63545304e-12 +
                             local_8c8 * -9.48213152e-09 +
                             local_8d8 * 1.24406669e-05 + dVar70 * -0.00495416684 + 4.79372315;
              tresult[0xf] = dVar71 * 978.6011 +
                             local_8b8 * 4.15122e-13 +
                             local_8c8 * -1.844409e-09 +
                             local_8d8 * 1.77949067e-06 + dVar70 * 0.0036082975 + 2.106204;
              tresult[0x10] =
                   dVar71 * 5089.77593 +
                   local_8b8 * 5.39768746e-12 +
                   local_8c8 * -1.72897188e-08 +
                   local_8d8 * 1.90330097e-05 + dVar70 * -0.00378526124 + 3.95920148;
              tresult[0x11] =
                   dVar71 * 12841.6265 +
                   local_8b8 * 4.61018008e-12 +
                   local_8c8 * -1.49781651e-08 +
                   local_8d8 * 1.65714269e-05 + dVar70 * -0.00209329446 + 4.30646568;
              dVar73 = local_8b8 * 5.37371542e-12 +
                       local_8c8 * -1.77116571e-08 +
                       local_8d8 * 1.99812763e-05 + dVar70 * -0.00275077135 + 4.29142492;
              dVar74 = local_8b8 * -4.889708e-13 +
                       local_8c8 * 1.41037875e-09 +
                       local_8d8 * -1.321074e-06 + dVar70 * 0.0007041202 + 3.298677;
              dVar1 = -11522.2055;
              dVar2 = -1020.8999;
            }
            tresult[0x12] = dVar71 * dVar1 + dVar73;
            tresult[0x13] = dVar71 * dVar2 + dVar74;
            tresult[0x14] = dVar71 * -745.375 + dVar68;
            for (lVar50 = 0; lVar50 != 0x15; lVar50 = lVar50 + 1) {
              tresult[lVar50] = cpor[lVar50] * dVar70 * 83144626.1815324 * tresult[lVar50];
            }
            for (lVar50 = 0; lVar50 != 0x15; lVar50 = lVar50 + 1) {
              tresult[lVar50] = tresult[lVar50] * 0.0001;
            }
            lVar50 = lVar51 - lVar35;
            dVar4 = 1.0 / (dVar4 * dVar69 * 83144626.1815324 * 0.0001 *
                          pdVar23[lVar46 + lVar48 + (lVar51 - lVar29)]);
            dVar70 = (pdVar11[lVar47 + lVar49 + lVar50] +
                     pdVar20[(lVar57 - lVar34) * LVar22 +
                             (lVar54 - lVar33) * LVar21 + (lVar51 - lVar32)]) * dVar4;
            pdVar11[lVar47 + lVar49 + lVar50] = dVar70;
            for (lVar53 = 0; lVar53 != 0x15; lVar53 = lVar53 + 1) {
              dVar68 = local_598[lVar53];
              dVar70 = ((1.0 / dVar72) * dVar68 * dVar75 - tresult[lVar53] * dVar4) *
                       (*pdVar66 + *pdVar58) + dVar70;
              pdVar11[lVar47 + lVar49 + lVar50] = dVar70;
              dVar70 = dVar68 * *pdVar63 * (1.0 / dVar72) * dVar75 + dVar70;
              pdVar11[lVar47 + lVar49 + lVar50] = dVar70;
              pdVar63 = pdVar63 + LVar7;
              pdVar58 = pdVar58 + LVar8;
              pdVar66 = pdVar66 + LVar9;
            }
            dVar70 = dVar75 * pdVar17[(lVar57 - lVar40) * LVar19 +
                                      (lVar54 - lVar39) * LVar18 + (lVar51 - lVar38)] + dVar70;
            pdVar11[lVar47 + lVar49 + lVar50] = dVar70;
            pdVar11[lVar47 + lVar49 + lVar50] =
                 dVar4 * pdVar14[(lVar57 - lVar43) * LVar16 +
                                 (lVar54 - lVar42) * LVar15 + (lVar51 - lVar41)] + dVar70;
            bVar67 = iVar26 != iVar6;
            iVar26 = iVar26 + 1;
          } while (bVar67);
        }
        local_bb0 = local_bb0 + lVar60;
        local_ba8 = local_ba8 + lVar61;
        local_ba0 = local_ba0 + lVar65;
        local_b98 = local_b98 + lVar64;
      }
      local_bb8 = local_bb8 + lVar55;
      local_b80 = local_b80 + lVar59;
      local_b88 = local_b88 + lVar27;
      local_b90 = local_b90 + lVar28;
    }
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  amrex::EB_set_covered(divu,0.0);
  amrex::MultiFab::~MultiFab(&RhoYdotTmp);
  amrex::MultiFab::~MultiFab(&mcViscTerms);
  return;
}

Assistant:

void
PeleLM::calc_divu (Real      time,
                   Real      dt,
                   MultiFab& divu)
{
   BL_PROFILE("PLM::calc_divu()");

   const int nGrow = 0;
   int vtCompT = NUM_SPECIES + 1;
   int vtCompY = 0;
   MultiFab mcViscTerms(grids,dmap,NUM_SPECIES+2,nGrow,MFInfo(),Factory());

   // we don't want to update flux registers due to fluxes in divu computation
   bool do_reflux_hold = do_reflux;
   do_reflux = false;

   // DD is computed and stored in divu, and passed in to initialize the calc of divu
   bool include_Wbar_terms = true;
   compute_differential_diffusion_terms(mcViscTerms,divu,time,dt,include_Wbar_terms);

   do_reflux = do_reflux_hold;

   // if we are in the initial projection (time=0, dt=-1), set RhoYdot=0
   // if we are in a divu_iter (time=0, dt>0), use I_R
   // if we are in an init_iter or regular time step (time=dt, dt>0), use instananeous
   MultiFab   RhoYdotTmp;
   MultiFab&  S       = get_data(State_Type,time);
   const bool use_IR  = (time == 0 && dt > 0);

   MultiFab& RhoYdot = (use_IR) ? get_new_data(RhoYdot_Type) : RhoYdotTmp;

   if (!use_IR)
   {
     if (time == 0)
     {
       // initial projection, set omegadot to zero
       RhoYdot.define(grids,dmap,NUM_SPECIES,0,MFInfo(),Factory());
       RhoYdot.setVal(0.0);
     }
     else if (dt > 0)
     {
       // init_iter or regular time step, use instantaneous omegadot
       RhoYdot.define(grids,dmap,NUM_SPECIES,0,MFInfo(),Factory());
       compute_instantaneous_reaction_rates(RhoYdot,S,time,nGrow);
     }
     else
     {
       amrex::Abort("bad divu_logic - shouldn't be here");
     }
   }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& bx = mfi.tilebox();
      auto const& rhoY    = S.const_array(mfi,first_spec);
      auto const& T       = S.const_array(mfi,Temp);
      auto const& vtT     = mcViscTerms.const_array(mfi,vtCompT);
      auto const& vtY     = mcViscTerms.const_array(mfi,vtCompY);
      auto const& rhoYdot = RhoYdot.const_array(mfi);
      auto const& extRho  = external_sources.const_array(mfi,Density);
      auto const& extY    = external_sources.const_array(mfi,DEF_first_spec);
      auto const& extRhoH = external_sources.const_array(mfi,DEF_RhoH);
      auto const& du      = divu.array(mfi);

      amrex::ParallelFor(bx, [ rhoY, T, vtT, vtY, rhoYdot, du, extRho, extY, extRhoH]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
         compute_divu( i, j, k, rhoY, T, vtT, vtY, rhoYdot, extRho, extY, extRhoH, du );
      });
   }

#ifdef AMREX_USE_EB
   EB_set_covered(divu,0.);
#endif
}